

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O0

int __thiscall
helics::zeromq::ZmqCommsSS::processIncomingMessage
          (ZmqCommsSS *this,message_t *msg,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *connection_info)

{
  string_view message;
  bool bVar1;
  size_t sVar2;
  ostream *this_00;
  size_type sVar3;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sdata;
  bool handled;
  ActionMessage M;
  string str;
  int status;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  ActionMessage *in_stack_fffffffffffffcc0;
  int index;
  undefined4 in_stack_fffffffffffffcc8;
  ConnectionStatus in_stack_fffffffffffffccc;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffce0;
  ActionMessage *in_stack_fffffffffffffce8;
  NetworkCommsInterface *in_stack_fffffffffffffcf0;
  ActionMessage *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd30;
  size_t in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  int local_284;
  duration<long,std::ratio<1l,1l>> local_280 [40];
  undefined4 local_258;
  _Base_ptr local_240;
  undefined1 in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdc9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  byte local_1d1;
  ActionMessage local_118;
  uint local_60;
  allocator<char> local_49 [37];
  int local_24;
  int local_4;
  
  local_24 = 0;
  sVar2 = zmq::message_t::size((message_t *)in_stack_fffffffffffffcc0);
  if (sVar2 == 5) {
    zmq::message_t::data((message_t *)in_stack_fffffffffffffcc0);
    zmq::message_t::size((message_t *)in_stack_fffffffffffffcc0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (size_type)in_stack_fffffffffffffcd0._M_node,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    std::allocator<char>::~allocator(local_49);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffcc0,
                            (char *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
    if (bVar1) {
      local_4 = -1;
    }
    local_60 = (uint)bVar1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcc0);
    if (local_60 != 0) {
      return local_4;
    }
  }
  startingAction = (action_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  zmq::message_t::data((message_t *)in_stack_fffffffffffffcc0);
  zmq::message_t::size((message_t *)in_stack_fffffffffffffcc0);
  ActionMessage::ActionMessage
            ((ActionMessage *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             (size_t)in_stack_fffffffffffffce0);
  bVar1 = isValidCommand((ActionMessage *)0x4dc295);
  if (bVar1) {
    local_1d1 = 0;
    bVar1 = isProtocolCommand(in_stack_fffffffffffffcc0);
    if (bVar1) {
      local_1d1 = 1;
      if (local_118.messageID == 299) {
        if ((*(byte *)(in_RDI + 0x25b) & 1) != 0) {
          ActionMessage::getStringData_abi_cxx11_(&local_118);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_1f0);
          if (sVar3 == 3) {
            ActionMessage::name((ActionMessage *)0x4dc5d7);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_1f0,2);
            std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcd0._M_node,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcc0);
          }
          else {
            ActionMessage::name((ActionMessage *)0x4dc68c);
            SmallBuffer::to_string((SmallBuffer *)0x4dc6bf);
            pVar4 = std::
                    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    ::
                    emplace<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffffcd0._M_node,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffcc0);
            in_stack_fffffffffffffcd0 = pVar4.first._M_node;
            local_240 = in_stack_fffffffffffffcd0._M_node;
          }
          local_24 = 3;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcd0._M_node);
        }
      }
      else if (local_118.messageID == 0x130) {
        CommsInterface::setTxStatus
                  ((CommsInterface *)in_stack_fffffffffffffcd0._M_node,in_stack_fffffffffffffccc);
      }
      else if (local_118.messageID == 0x14d) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffffcd0._M_node,
                   (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        index = (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
        message._M_str = in_stack_fffffffffffffd40;
        message._M_len = in_stack_fffffffffffffd38;
        CommsInterface::logMessage
                  ((CommsInterface *)CONCAT44(local_118.messageID,in_stack_fffffffffffffd30),message
                  );
        in_stack_fffffffffffffcc0 =
             (ActionMessage *)
             ActionMessage::getString_abi_cxx11_
                       ((ActionMessage *)
                        CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),index);
        gmlc::networking::extractInterfaceAndPort
                  ((string *)CONCAT71(in_stack_fffffffffffffdc9,in_stack_fffffffffffffdc8));
        *(undefined4 *)(in_RDI + 0x410) = local_258;
        in_stack_fffffffffffffcbf =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffcc0,
                             (char *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
        if (((in_stack_fffffffffffffcbf ^ 0xff) & 1) != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
        }
        local_24 = 5;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)0x4dc835);
      }
      else if (local_118.messageID == 0x5ab) {
        NetworkCommsInterface::loadPortDefinitions
                  (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      }
      else if (local_118.messageID == 1999) {
        CommsInterface::setRxStatus
                  ((CommsInterface *)in_stack_fffffffffffffcd0._M_node,in_stack_fffffffffffffccc);
      }
      else if (local_118.messageID == 0x9db) {
        std::atomic<bool>::operator=
                  ((atomic<bool> *)in_stack_fffffffffffffcc0,(bool)in_stack_fffffffffffffcbf);
        CommsInterface::setRxStatus
                  ((CommsInterface *)in_stack_fffffffffffffcd0._M_node,in_stack_fffffffffffffccc);
        local_24 = -1;
      }
      else if (local_118.messageID == 0xa3f) {
        std::atomic<bool>::operator=
                  ((atomic<bool> *)in_stack_fffffffffffffcc0,(bool)in_stack_fffffffffffffcbf);
        CommsInterface::setRxStatus
                  ((CommsInterface *)in_stack_fffffffffffffcd0._M_node,in_stack_fffffffffffffccc);
        local_24 = -1;
      }
      else if (local_118.messageID == 0xaa6) {
        std::atomic<bool>::operator=
                  ((atomic<bool> *)in_stack_fffffffffffffcc0,(bool)in_stack_fffffffffffffcbf);
        CommsInterface::setRxStatus
                  ((CommsInterface *)in_stack_fffffffffffffcd0._M_node,in_stack_fffffffffffffccc);
        local_24 = -1;
      }
      else if (local_118.messageID == 0xed3) {
        local_284 = 2;
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_280,&local_284);
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)
                   CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
        local_24 = 5;
      }
      else if (local_118.messageID == 0x16570bf) {
        CommsInterface::setRxStatus
                  ((CommsInterface *)in_stack_fffffffffffffcd0._M_node,in_stack_fffffffffffffccc);
        local_24 = -1;
      }
      else {
        local_1d1 = 0;
      }
    }
    if ((local_1d1 & 1) == 0) {
      std::function<void_(helics::ActionMessage_&&)>::operator()
                ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffffcc0,
                 (ActionMessage *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
    }
    local_4 = local_24;
  }
  else {
    std::operator<<((ostream *)&std::cerr,"invalid command received");
    ActionMessage::action(&local_118);
    ActionMessage::ActionMessage(in_stack_fffffffffffffce0,startingAction);
    this_00 = helics::operator<<((ostream *)
                                 CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                                 in_stack_fffffffffffffcf8);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    ActionMessage::~ActionMessage(in_stack_fffffffffffffcc0);
    local_4 = 0;
  }
  local_60 = 1;
  ActionMessage::~ActionMessage(in_stack_fffffffffffffcc0);
  return local_4;
}

Assistant:

int ZmqCommsSS::processIncomingMessage(zmq::message_t& msg,
                                       std::map<std::string, std::string>& connection_info)
{
    int status = 0;
    if (msg.size() == 5) {
        std::string str(static_cast<char*>(msg.data()), msg.size());
        if (str == "close") {
            return (-1);
        }
    }
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());

    if (!isValidCommand(M)) {
        std::cerr << "invalid command received" << M.action() << std::endl;
        return 0;
    }
    bool handled{false};
    if (isProtocolCommand(M)) {
        handled = true;
        switch (M.messageID) {
            case PORT_DEFINITIONS:
                loadPortDefinitions(M);
                break;
            case NAME_NOT_FOUND:
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                status = -1;
                break;
            case CONNECTION_ACK:
                setTxStatus(ConnectionStatus::CONNECTED);
                break;
            case DISCONNECT:
                disconnecting = true;
                setRxStatus(ConnectionStatus::TERMINATED);
                status = -1;
                break;
            case DISCONNECT_ERROR:
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                status = -1;
                break;
            case CLOSE_RECEIVER:
                setRxStatus(ConnectionStatus::TERMINATED);
                status = -1;
                break;
            case RECONNECT_RECEIVER:
                setRxStatus(ConnectionStatus::CONNECTED);
                break;
            case CONNECTION_INFORMATION:
                if (serverMode) {
                    auto sdata = M.getStringData();
                    if (sdata.size() == 3) {
                        connection_info.emplace(M.name(), sdata[2]);
                    } else {
                        connection_info.emplace(M.name(), M.payload.to_string());
                    }
                    status = 3;
                }
                break;
            case NEW_BROKER_INFORMATION: {
                logMessage("got new broker information");
                auto brkprt = gmlc::networking::extractInterfaceAndPort(M.getString(0));
                brokerPort = brkprt.second;
                if (brkprt.first != "?") {
                    brokerTargetAddress = brkprt.first;
                }
                status = 5;
            } break;
            case DELAY_CONNECTION:
                std::this_thread::sleep_for(std::chrono::seconds(2));
                status = 5;  // need to reconnect after this
                break;
            default:
                handled = false;
                break;
        }
    }
    if (!handled) {
        ActionCallback(std::move(M));
    }
    return status;
}